

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ncnn2int8.cpp
# Opt level: O0

int __thiscall NetQuantize::quantize_innerproduct(NetQuantize *this)

{
  int *piVar1;
  long *plVar2;
  FILE *__stream;
  value_type pLVar3;
  bool bVar4;
  size_type sVar5;
  undefined8 uVar6;
  reference ppLVar7;
  pointer ppVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  *paVar9;
  void **ppvVar10;
  void **ppvVar11;
  long in_RDI;
  Option opt_q;
  Mat weight_data_int8;
  Mat weight_data_r2;
  int num_input;
  Mat weight_data_int8_scales;
  Mat bottom_blob_int8_scales;
  InnerProduct *fc;
  iterator iter;
  char key [256];
  iterator iter_data;
  int i;
  int layer_count;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ncnn::Mat,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ncnn::Mat>_>_>
  *in_stack_fffffffffffff988;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff990;
  uint7 in_stack_fffffffffffffa08;
  undefined1 in_stack_fffffffffffffa0f;
  void **in_stack_fffffffffffffa10;
  uint7 in_stack_fffffffffffffa18;
  undefined1 in_stack_fffffffffffffa1f;
  void *local_578;
  int *local_570;
  Option *in_stack_fffffffffffffa98;
  undefined4 uVar12;
  Mat *in_stack_fffffffffffffaa0;
  Mat *in_stack_fffffffffffffaa8;
  Mat *in_stack_fffffffffffffab0;
  void *local_4e0;
  int *local_4d8;
  undefined8 local_4d0;
  undefined4 local_4c8;
  long *local_4c0;
  undefined4 local_4b8;
  undefined4 local_4b4;
  undefined4 local_4b0;
  undefined4 local_4ac;
  int local_4a8;
  long local_4a0;
  void *local_498;
  int *local_490;
  undefined8 local_488;
  undefined4 local_480;
  long *local_478;
  undefined4 local_470;
  undefined4 local_46c;
  undefined4 local_468;
  undefined4 local_464;
  undefined4 local_460;
  undefined8 local_458;
  int local_44c;
  void *local_448;
  int *local_440;
  size_t local_438;
  int local_430;
  Allocator *local_428;
  int local_420;
  int local_41c;
  int local_418;
  int local_414;
  int local_410;
  size_t local_408;
  void *local_400;
  int *local_3f8;
  size_t local_3f0;
  int local_3e8;
  Allocator *local_3e0;
  int local_3d8;
  int local_3d4;
  int local_3d0;
  int local_3cc;
  int local_3c8;
  size_t local_3c0;
  value_type local_3b8;
  _Self local_3b0 [3];
  allocator local_391;
  string local_390 [32];
  _Self local_370;
  char local_368 [256];
  _Self local_268;
  _Self local_260;
  int local_258;
  int local_254;
  int local_244;
  void **local_240;
  void **local_238;
  void **local_228;
  void **local_218;
  void **local_208;
  void **local_1f8;
  int local_1e8;
  undefined4 local_1e4;
  void **local_1e0;
  void **local_1d8;
  void **local_1d0;
  int local_1c8;
  undefined4 local_1c4;
  void **local_1c0;
  void **local_1b8;
  void **local_1b0;
  int local_1a8;
  undefined4 local_1a4;
  void **local_1a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  *local_198;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  *local_190;
  void **local_188;
  Mat *local_180;
  void **local_178;
  Mat *local_170;
  void **local_168;
  int local_160;
  undefined4 local_15c;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  *local_158;
  int local_150;
  undefined4 local_14c;
  void **local_148;
  int local_140;
  undefined4 local_13c;
  void **local_138;
  int local_120;
  undefined4 local_11c;
  void **local_118;
  int local_100;
  undefined4 local_fc;
  void **local_f8;
  int local_e0;
  undefined4 local_dc;
  void **local_d8;
  int local_c0;
  undefined4 local_bc;
  void **local_b8;
  int local_a0;
  undefined4 local_9c;
  void **local_98;
  void *local_90;
  void *local_80;
  void *local_70;
  void *local_60;
  void *local_50;
  void *local_40;
  void *local_38;
  void *local_30;
  void **local_28;
  int local_20;
  undefined4 local_1c;
  void **local_18;
  int local_10;
  undefined4 local_c;
  void **local_8;
  
  sVar5 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::size
                    (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)(in_RDI + 0x58));
  local_254 = (int)sVar5;
  local_258 = 0;
  do {
    if (local_254 <= local_258) {
      return 0;
    }
    std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
              (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)(in_RDI + 0x58),
               (long)local_258);
    bVar4 = std::operator!=(in_stack_fffffffffffff990,(char *)in_stack_fffffffffffff988);
    if (!bVar4) {
      std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)(in_RDI + 0x58),
                 (long)local_258);
      local_260._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ncnn::Mat,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ncnn::Mat>_>_>
           ::find(in_stack_fffffffffffff988,(key_type *)0x1835b1);
      local_268._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ncnn::Mat,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ncnn::Mat>_>_>
           ::end(in_stack_fffffffffffff988);
      bVar4 = std::operator==(&local_260,&local_268);
      if (!bVar4) {
        std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                  (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)(in_RDI + 0x58),
                   (long)local_258);
        uVar6 = std::__cxx11::string::c_str();
        sprintf(local_368,"%s_param_0",uVar6);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_390,local_368,&local_391);
        local_370._M_node =
             (_Base_ptr)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ncnn::Mat,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ncnn::Mat>_>_>
             ::find(in_stack_fffffffffffff988,(key_type *)0x183697);
        std::__cxx11::string::~string(local_390);
        std::allocator<char>::~allocator((allocator<char> *)&local_391);
        local_3b0[0]._M_node =
             (_Base_ptr)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ncnn::Mat,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ncnn::Mat>_>_>
             ::end(in_stack_fffffffffffff988);
        bVar4 = std::operator==(&local_370,local_3b0);
        if (bVar4) {
          fprintf(_stderr,"this layer need to be quantized, but no scale param!\n");
          return -1;
        }
        ppLVar7 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                            (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)
                              (in_RDI + 0x58),(long)local_258);
        local_3b8 = *ppLVar7;
        ppVar8 = std::
                 _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ncnn::Mat>_>
                 ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ncnn::Mat>_>
                               *)0x1837a4);
        local_180 = &ppVar8->second;
        local_178 = &local_400;
        local_400 = local_180->data;
        local_3f8 = (ppVar8->second).refcount;
        local_3f0 = (ppVar8->second).elemsize;
        local_3e8 = (ppVar8->second).elempack;
        local_3e0 = (ppVar8->second).allocator;
        local_3d8 = (ppVar8->second).dims;
        local_3d4 = (ppVar8->second).w;
        local_3d0 = (ppVar8->second).h;
        local_3cc = (ppVar8->second).d;
        local_3c8 = (ppVar8->second).c;
        local_3c0 = (ppVar8->second).cstep;
        if (local_3f8 != (int *)0x0) {
          local_c = 1;
          LOCK();
          local_10 = *local_3f8;
          *local_3f8 = *local_3f8 + 1;
          UNLOCK();
        }
        local_8 = local_178;
        ppVar8 = std::
                 _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ncnn::Mat>_>
                 ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ncnn::Mat>_>
                               *)0x1838c7);
        local_170 = &ppVar8->second;
        local_168 = &local_448;
        local_448 = local_170->data;
        local_440 = (ppVar8->second).refcount;
        local_438 = (ppVar8->second).elemsize;
        local_430 = (ppVar8->second).elempack;
        local_428 = (ppVar8->second).allocator;
        local_420 = (ppVar8->second).dims;
        local_41c = (ppVar8->second).w;
        local_418 = (ppVar8->second).h;
        local_414 = (ppVar8->second).d;
        local_410 = (ppVar8->second).c;
        local_408 = (ppVar8->second).cstep;
        if (local_440 != (int *)0x0) {
          local_1c = 1;
          LOCK();
          local_20 = *local_440;
          *local_440 = *local_440 + 1;
          UNLOCK();
        }
        __stream = _stderr;
        local_18 = local_168;
        uVar6 = std::__cxx11::string::c_str();
        fprintf(__stream,"quantize_innerproduct %s\n",uVar6);
        local_44c = *(int *)&local_3b8[1].one_blob_only / *(int *)&local_3b8[1]._vptr_Layer;
        ncnn::Mat::reshape((Mat *)CONCAT17(in_stack_fffffffffffffa1f,in_stack_fffffffffffffa18),
                           (int)((ulong)in_stack_fffffffffffffa10 >> 0x20),
                           (int)in_stack_fffffffffffffa10,
                           (Allocator *)
                           CONCAT17(in_stack_fffffffffffffa0f,in_stack_fffffffffffffa08));
        local_240 = &local_4e0;
        local_4e0 = (void *)0x0;
        local_4d8 = (int *)0x0;
        local_4d0 = 0;
        local_4c8 = 0;
        local_4c0 = (long *)0x0;
        local_4b8 = 0;
        local_4b4 = 0;
        local_4b0 = 0;
        local_4ac = 0;
        local_4a8 = 0;
        local_4a0 = 0;
        ncnn::quantize_to_int8
                  (in_stack_fffffffffffffab0,in_stack_fffffffffffffaa8,in_stack_fffffffffffffaa0,
                   in_stack_fffffffffffffa98);
        in_stack_fffffffffffffa10 = &local_4e0;
        if (local_4e0 != (void *)0x0) {
          local_28 = in_stack_fffffffffffffa10;
        }
        in_stack_fffffffffffffa0f = local_4e0 == (void *)0x0 || local_4a0 * local_4a8 == 0;
        in_stack_fffffffffffffa1f = in_stack_fffffffffffffa0f;
        local_188 = in_stack_fffffffffffffa10;
        if ((bool)in_stack_fffffffffffffa0f) {
          local_244 = -100;
          bVar4 = true;
        }
        else {
          ncnn::Mat::reshape((Mat *)(ulong)in_stack_fffffffffffffa18,
                             (int)((ulong)in_stack_fffffffffffffa10 >> 0x20),
                             (Allocator *)(ulong)in_stack_fffffffffffffa08);
          pLVar3 = local_3b8;
          paVar9 = &local_3b8[1].name.field_2;
          local_1a0 = &local_578;
          local_198 = paVar9;
          if (paVar9 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
                         *)local_1a0) {
            if (local_570 != (int *)0x0) {
              local_1a4 = 1;
              LOCK();
              local_1a8 = *local_570;
              *local_570 = *local_570 + 1;
              UNLOCK();
            }
            local_158 = paVar9;
            if (*(long *)((long)&local_3b8[1].name.field_2 + 8) != 0) {
              piVar1 = *(int **)((long)&local_3b8[1].name.field_2 + 8);
              local_15c = 0xffffffff;
              LOCK();
              local_160 = *piVar1;
              *piVar1 = *piVar1 + -1;
              UNLOCK();
              if (local_160 == 1) {
                if (local_3b8[1].bottoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage == (pointer)0x0) {
                  local_30 = (void *)paVar9->_M_allocated_capacity;
                  if (local_30 != (void *)0x0) {
                    free(local_30);
                  }
                }
                else {
                  plVar2 = (long *)local_3b8[1].bottoms.
                                   super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_end_of_storage;
                  (**(code **)(*plVar2 + 0x18))(plVar2,paVar9->_M_allocated_capacity);
                }
              }
            }
            paVar9->_M_allocated_capacity = 0;
            pLVar3[1].bottoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            *(undefined4 *)
             &pLVar3[1].bottoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish = 0;
            *(undefined4 *)
             &pLVar3[1].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start = 0;
            *(undefined4 *)
             ((long)&pLVar3[1].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start + 4) = 0;
            *(undefined4 *)
             &pLVar3[1].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish = 0;
            *(undefined4 *)
             ((long)&pLVar3[1].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish + 4) = 0;
            *(undefined4 *)
             &pLVar3[1].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = 0;
            pLVar3[1].bottom_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
            _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            *(undefined8 *)((long)&pLVar3[1].name.field_2 + 8) = 0;
            paVar9->_M_allocated_capacity = (size_type)*local_1a0;
            *(void **)((long)&pLVar3[1].name.field_2 + 8) = local_1a0[1];
            pLVar3[1].bottoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)local_1a0[2];
            *(undefined4 *)
             &pLVar3[1].bottoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish = *(undefined4 *)(local_1a0 + 3);
            pLVar3[1].bottoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)local_1a0[4];
            *(undefined4 *)
             &pLVar3[1].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start = *(undefined4 *)(local_1a0 + 5);
            *(undefined4 *)
             ((long)&pLVar3[1].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start + 4) = *(undefined4 *)((long)local_1a0 + 0x2c)
            ;
            *(undefined4 *)
             &pLVar3[1].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish = *(undefined4 *)(local_1a0 + 6);
            *(undefined4 *)
             ((long)&pLVar3[1].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish + 4) =
                 *(undefined4 *)((long)local_1a0 + 0x34);
            *(undefined4 *)
             &pLVar3[1].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = *(undefined4 *)(local_1a0 + 7);
            pLVar3[1].bottom_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
            _M_impl.super__Vector_impl_data._M_start = (pointer)local_1a0[8];
          }
          local_238 = &local_578;
          local_190 = paVar9;
          local_98 = local_238;
          if (local_570 != (int *)0x0) {
            local_9c = 0xffffffff;
            LOCK();
            local_a0 = *local_570;
            *local_570 = *local_570 + -1;
            UNLOCK();
            if (local_a0 == 1) {
              if (in_stack_fffffffffffffaa8 == (Mat *)0x0) {
                local_90 = local_578;
                if (local_578 != (void *)0x0) {
                  free(local_578);
                }
              }
              else {
                (**(code **)((long)in_stack_fffffffffffffaa8->data + 0x18))
                          (in_stack_fffffffffffffaa8,local_578);
              }
            }
          }
          local_578 = (void *)0x0;
          in_stack_fffffffffffffa98 = (Option *)0x0;
          uVar12 = 0;
          uVar12 = 0;
          local_570 = (int *)0x0;
          bVar4 = false;
        }
        local_228 = &local_4e0;
        local_b8 = local_228;
        if (local_4d8 != (int *)0x0) {
          local_bc = 0xffffffff;
          LOCK();
          local_c0 = *local_4d8;
          *local_4d8 = *local_4d8 + -1;
          UNLOCK();
          if (local_c0 == 1) {
            if (local_4c0 == (long *)0x0) {
              local_80 = local_4e0;
              if (local_4e0 != (void *)0x0) {
                free(local_4e0);
              }
            }
            else {
              (**(code **)(*local_4c0 + 0x18))(local_4c0,local_4e0);
            }
          }
        }
        local_4e0 = (void *)0x0;
        local_4d0 = 0;
        local_4c8 = 0;
        local_4b8 = 0;
        local_4b4 = 0;
        local_4b0 = 0;
        local_4ac = 0;
        local_4a8 = 0;
        local_4a0 = 0;
        local_4d8 = (int *)0x0;
        local_218 = &local_498;
        local_d8 = local_218;
        if (local_490 != (int *)0x0) {
          local_dc = 0xffffffff;
          LOCK();
          local_e0 = *local_490;
          *local_490 = *local_490 + -1;
          UNLOCK();
          if (local_e0 == 1) {
            if (local_478 == (long *)0x0) {
              local_70 = local_498;
              if (local_498 != (void *)0x0) {
                free(local_498);
              }
            }
            else {
              (**(code **)(*local_478 + 0x18))(local_478,local_498);
            }
          }
        }
        pLVar3 = local_3b8;
        local_498 = (void *)0x0;
        local_488 = 0;
        local_480 = 0;
        local_470 = 0;
        local_46c = 0;
        local_468 = 0;
        local_464 = 0;
        local_460 = 0;
        local_458 = 0;
        local_490 = (int *)0x0;
        if (!bVar4) {
          local_3b8[1].support_bf16_storage = true;
          local_3b8[1].support_fp16_storage = false;
          local_3b8[1].support_int8_storage = false;
          local_3b8[1].support_image_storage = false;
          ppvVar10 = &local_3b8[2].userdata;
          local_1c0 = &local_448;
          local_1b8 = ppvVar10;
          if (ppvVar10 != local_1c0) {
            if (local_440 != (int *)0x0) {
              local_1c4 = 1;
              LOCK();
              local_1c8 = *local_440;
              *local_440 = *local_440 + 1;
              UNLOCK();
            }
            local_148 = ppvVar10;
            if (*(long *)&local_3b8[2].typeindex != 0) {
              piVar1 = *(int **)&local_3b8[2].typeindex;
              local_14c = 0xffffffff;
              LOCK();
              local_150 = *piVar1;
              *piVar1 = *piVar1 + -1;
              UNLOCK();
              if (local_150 == 1) {
                if (local_3b8[2].type.field_2._M_allocated_capacity == 0) {
                  local_38 = *ppvVar10;
                  if (local_38 != (void *)0x0) {
                    free(local_38);
                  }
                }
                else {
                  plVar2 = *(long **)&local_3b8[2].type.field_2;
                  (**(code **)(*plVar2 + 0x18))(plVar2,*ppvVar10);
                }
              }
            }
            *ppvVar10 = (void *)0x0;
            *(undefined8 *)&pLVar3[2].type = 0;
            *(undefined4 *)&pLVar3[2].type._M_string_length = 0;
            *(undefined4 *)((long)&pLVar3[2].type.field_2 + 8) = 0;
            *(undefined4 *)((long)&pLVar3[2].type.field_2 + 0xc) = 0;
            *(undefined4 *)&pLVar3[2].name = 0;
            *(undefined4 *)&pLVar3[2].name.field_0x4 = 0;
            *(undefined4 *)&pLVar3[2].name._M_string_length = 0;
            pLVar3[2].name.field_2._M_allocated_capacity = 0;
            *(undefined8 *)&pLVar3[2].typeindex = 0;
            *ppvVar10 = *local_1c0;
            *(void **)&pLVar3[2].typeindex = local_1c0[1];
            *(void **)&pLVar3[2].type = local_1c0[2];
            *(undefined4 *)&pLVar3[2].type._M_string_length = *(undefined4 *)(local_1c0 + 3);
            pLVar3[2].type.field_2._M_allocated_capacity = (size_type)local_1c0[4];
            *(undefined4 *)((long)&pLVar3[2].type.field_2 + 8) = *(undefined4 *)(local_1c0 + 5);
            *(undefined4 *)((long)&pLVar3[2].type.field_2 + 0xc) =
                 *(undefined4 *)((long)local_1c0 + 0x2c);
            *(undefined4 *)&pLVar3[2].name = *(undefined4 *)(local_1c0 + 6);
            *(undefined4 *)&pLVar3[2].name.field_0x4 = *(undefined4 *)((long)local_1c0 + 0x34);
            *(undefined4 *)&pLVar3[2].name._M_string_length = *(undefined4 *)(local_1c0 + 7);
            pLVar3[2].name.field_2._M_allocated_capacity = (size_type)local_1c0[8];
          }
          pLVar3 = local_3b8;
          ppvVar11 = (void **)((long)&local_3b8[2].name.field_2 + 8);
          local_1e0 = &local_400;
          local_1d8 = ppvVar11;
          local_1b0 = ppvVar10;
          if (ppvVar11 != local_1e0) {
            if (local_3f8 != (int *)0x0) {
              local_1e4 = 1;
              LOCK();
              local_1e8 = *local_3f8;
              *local_3f8 = *local_3f8 + 1;
              UNLOCK();
            }
            local_138 = ppvVar11;
            if (local_3b8[2].bottoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              piVar1 = local_3b8[2].bottoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start;
              local_13c = 0xffffffff;
              LOCK();
              local_140 = *piVar1;
              *piVar1 = *piVar1 + -1;
              UNLOCK();
              if (local_140 == 1) {
                if (local_3b8[2].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start == (pointer)0x0) {
                  local_40 = *ppvVar11;
                  if (local_40 != (void *)0x0) {
                    free(local_40);
                  }
                }
                else {
                  plVar2 = (long *)local_3b8[2].tops.super__Vector_base<int,_std::allocator<int>_>.
                                   _M_impl.super__Vector_impl_data._M_start;
                  (**(code **)(*plVar2 + 0x18))(plVar2,*ppvVar11);
                }
              }
            }
            *ppvVar11 = (void *)0x0;
            pLVar3[2].bottoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            *(undefined4 *)
             &pLVar3[2].bottoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = 0;
            *(undefined4 *)
             &pLVar3[2].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish = 0;
            *(undefined4 *)
             ((long)&pLVar3[2].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish + 4) = 0;
            *(undefined4 *)
             &pLVar3[2].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = 0;
            *(undefined4 *)
             ((long)&pLVar3[2].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 4) = 0;
            *(undefined4 *)
             &pLVar3[2].bottom_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
              _M_impl.super__Vector_impl_data._M_start = 0;
            pLVar3[2].bottom_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
            _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            pLVar3[2].bottoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            *ppvVar11 = *local_1e0;
            pLVar3[2].bottoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)local_1e0[1];
            pLVar3[2].bottoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)local_1e0[2];
            *(undefined4 *)
             &pLVar3[2].bottoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = *(undefined4 *)(local_1e0 + 3);
            pLVar3[2].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)local_1e0[4];
            *(undefined4 *)
             &pLVar3[2].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish = *(undefined4 *)(local_1e0 + 5);
            *(undefined4 *)
             ((long)&pLVar3[2].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish + 4) =
                 *(undefined4 *)((long)local_1e0 + 0x2c);
            *(undefined4 *)
             &pLVar3[2].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = *(undefined4 *)(local_1e0 + 6);
            *(undefined4 *)
             ((long)&pLVar3[2].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 4) =
                 *(undefined4 *)((long)local_1e0 + 0x34);
            *(undefined4 *)
             &pLVar3[2].bottom_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
              _M_impl.super__Vector_impl_data._M_start = *(undefined4 *)(local_1e0 + 7);
            pLVar3[2].bottom_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
            _M_impl.super__Vector_impl_data._M_finish = (pointer)local_1e0[8];
          }
          bVar4 = false;
          local_1d0 = ppvVar11;
        }
        local_208 = &local_448;
        local_f8 = local_208;
        if (local_440 != (int *)0x0) {
          local_fc = 0xffffffff;
          LOCK();
          local_100 = *local_440;
          *local_440 = *local_440 + -1;
          UNLOCK();
          if (local_100 == 1) {
            if (local_428 == (Allocator *)0x0) {
              local_60 = local_448;
              if (local_448 != (void *)0x0) {
                free(local_448);
              }
            }
            else {
              (*local_428->_vptr_Allocator[3])(local_428,local_448);
            }
          }
        }
        local_448 = (void *)0x0;
        local_438 = 0;
        local_430 = 0;
        local_420 = 0;
        local_41c = 0;
        local_418 = 0;
        local_414 = 0;
        local_410 = 0;
        local_408 = 0;
        local_440 = (int *)0x0;
        local_1f8 = &local_400;
        local_118 = local_1f8;
        if (local_3f8 != (int *)0x0) {
          local_11c = 0xffffffff;
          LOCK();
          local_120 = *local_3f8;
          *local_3f8 = *local_3f8 + -1;
          UNLOCK();
          if (local_120 == 1) {
            if (local_3e0 == (Allocator *)0x0) {
              local_50 = local_400;
              if (local_400 != (void *)0x0) {
                free(local_400);
              }
            }
            else {
              (*local_3e0->_vptr_Allocator[3])(local_3e0,local_400);
            }
          }
        }
        local_400 = (void *)0x0;
        local_3f0 = 0;
        local_3e8 = 0;
        local_3d8 = 0;
        local_3d4 = 0;
        local_3d0 = 0;
        local_3cc = 0;
        local_3c8 = 0;
        local_3c0 = 0;
        local_3f8 = (int *)0x0;
        if (bVar4) {
          return local_244;
        }
      }
    }
    local_258 = local_258 + 1;
  } while( true );
}

Assistant:

int NetQuantize::quantize_innerproduct()
{
    const int layer_count = static_cast<int>(layers.size());
    for (int i = 0; i < layer_count; i++)
    {
        // find convolution layer
        if (layers[i]->type != "InnerProduct")
            continue;

        // find InnerProduct layer
        std::map<std::string, ncnn::Mat>::iterator iter_data = blob_int8scale_table.find(layers[i]->name);
        if (iter_data == blob_int8scale_table.end())
            continue;

        char key[256];
        sprintf(key, "%s_param_0", layers[i]->name.c_str());

        std::map<std::string, ncnn::Mat>::iterator iter = weight_int8scale_table.find(key);
        if (iter == weight_int8scale_table.end())
        {
            fprintf(stderr, "this layer need to be quantized, but no scale param!\n");
            return -1;
        }

        // InnerProduct - quantize weight from fp32 to int8
        ncnn::InnerProduct* fc = (ncnn::InnerProduct*)layers[i];

        ncnn::Mat bottom_blob_int8_scales = iter_data->second;
        ncnn::Mat weight_data_int8_scales = iter->second;

        fprintf(stderr, "quantize_innerproduct %s\n", fc->name.c_str());

        {
            const int num_input = fc->weight_data_size / fc->num_output;

            ncnn::Mat weight_data_r2 = fc->weight_data.reshape(num_input, fc->num_output);

            ncnn::Mat weight_data_int8;
            ncnn::Option opt_q = opt;
            opt_q.use_packing_layout = false;
            ncnn::quantize_to_int8(weight_data_r2, weight_data_int8, weight_data_int8_scales, opt_q);
            if (weight_data_int8.empty())
                return -100;

            fc->weight_data = weight_data_int8.reshape(fc->weight_data_size);
        }

        fc->int8_scale_term = 2;
        fc->weight_data_int8_scales = weight_data_int8_scales;
        fc->bottom_blob_int8_scales = bottom_blob_int8_scales;
    }

    return 0;
}